

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(CodeSinkingPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t end;
  BasicBlock *this_00;
  DefUseManager *this_01;
  size_type sVar3;
  Instruction *pIVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *this_02;
  BasicBlock *pBVar7;
  IRContext *this_03;
  bool used_in_multiple_blocks;
  uint32_t bb_used_in;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bbs_with_uses;
  
  uVar2 = Instruction::result_id(inst);
  if (uVar2 == 0) {
    __assert_fail("inst->result_id() != 0 && \"Instruction should have a result.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x4a,
                  "BasicBlock *spvtools::opt::CodeSinkingPass::FindNewBasicBlockFor(Instruction *)")
    ;
  }
  this_00 = IRContext::get_instr_block((this->super_Pass).context_,inst);
  bbs_with_uses._M_h._M_buckets = &bbs_with_uses._M_h._M_single_bucket;
  bbs_with_uses._M_h._M_bucket_count = 1;
  bbs_with_uses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  bbs_with_uses._M_h._M_element_count = 0;
  bbs_with_uses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  bbs_with_uses._M_h._M_rehash_policy._M_next_resize = 0;
  bbs_with_uses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = Pass::get_def_use_mgr(&this->super_Pass);
  local_70 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:80:13)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:80:13)>
             ::_M_manager;
  local_88._M_unused._M_object = &bbs_with_uses._M_h;
  local_88._8_8_ = this;
  analysis::DefUseManager::ForEachUse
            (this_01,inst,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  this_02 = this_00;
  while( true ) {
    uVar2 = BasicBlock::id(this_02);
    local_88._0_4_ = uVar2;
    sVar3 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&bbs_with_uses._M_h,(key_type_conflict *)local_88._M_pod_data);
    if (sVar3 != 0) break;
    pIVar4 = BasicBlock::terminator(this_02);
    if (pIVar4->opcode_ == OpBranch) {
      pIVar4 = BasicBlock::terminator(this_02);
      uVar2 = Instruction::GetSingleWordInOperand(pIVar4,0);
      pCVar5 = Pass::cfg(&this->super_Pass);
      pvVar6 = CFG::preds(pCVar5,uVar2);
      if ((long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start != 4) break;
      this_03 = (this->super_Pass).context_;
    }
    else {
      pIVar4 = BasicBlock::GetMergeInst(this_02);
      if ((pIVar4 == (Instruction *)0x0) || (pIVar4->opcode_ != OpSelectionMerge)) break;
      bb_used_in = 0;
      used_in_multiple_blocks = false;
      local_88._8_8_ = (CodeSinkingPass *)0x0;
      local_88._M_unused._M_object = ::operator_new(0x28);
      ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)local_88._M_unused._0_8_)->_M_buckets = (__buckets_ptr)this;
      ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)local_88._M_unused._0_8_)->_M_bucket_count = (size_type)this_02;
      (((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)local_88._M_unused._0_8_)->_M_before_begin)._M_nxt = (_Hash_node_base *)&bb_used_in;
      ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)local_88._M_unused._0_8_)->_M_element_count = (size_type)&used_in_multiple_blocks;
      *(_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        **)&((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_88._M_unused._0_8_)->_M_rehash_policy = &bbs_with_uses._M_h;
      local_70 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:124:31)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp:124:31)>
                 ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(this_02,(function<void_(unsigned_int_*)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (used_in_multiple_blocks != false) break;
      if (bb_used_in == 0) {
        this_03 = (this->super_Pass).context_;
        uVar2 = BasicBlock::MergeBlockIdIfAny(this_02);
      }
      else {
        pCVar5 = Pass::cfg(&this->super_Pass);
        pvVar6 = CFG::preds(pCVar5,bb_used_in);
        if ((long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start != 4) break;
        uVar2 = BasicBlock::MergeBlockIdIfAny(this_02);
        end = BasicBlock::id(this_00);
        bVar1 = IntersectsPath(this,uVar2,end,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&bbs_with_uses._M_h);
        if (bVar1) break;
        this_03 = (this->super_Pass).context_;
        uVar2 = bb_used_in;
      }
    }
    this_02 = IRContext::get_instr_block(this_03,uVar2);
  }
  pBVar7 = (BasicBlock *)0x0;
  if (this_02 != this_00) {
    pBVar7 = this_02;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&bbs_with_uses._M_h);
  return pBVar7;
}

Assistant:

BasicBlock* CodeSinkingPass::FindNewBasicBlockFor(Instruction* inst) {
  assert(inst->result_id() != 0 && "Instruction should have a result.");
  BasicBlock* original_bb = context()->get_instr_block(inst);
  BasicBlock* bb = original_bb;

  std::unordered_set<uint32_t> bbs_with_uses;
  get_def_use_mgr()->ForEachUse(
      inst, [&bbs_with_uses, this](Instruction* use, uint32_t idx) {
        if (use->opcode() != spv::Op::OpPhi) {
          BasicBlock* use_bb = context()->get_instr_block(use);
          if (use_bb) {
            bbs_with_uses.insert(use_bb->id());
          }
        } else {
          bbs_with_uses.insert(use->GetSingleWordOperand(idx + 1));
        }
      });

  while (true) {
    // If |inst| is used in |bb|, then |inst| cannot be moved any further.
    if (bbs_with_uses.count(bb->id())) {
      break;
    }

    // If |bb| has one successor (succ_bb), and |bb| is the only predecessor
    // of succ_bb, then |inst| can be moved to succ_bb.  If succ_bb, has move
    // then one predecessor, then moving |inst| into succ_bb could cause it to
    // be executed more often, so the search has to stop.
    if (bb->terminator()->opcode() == spv::Op::OpBranch) {
      uint32_t succ_bb_id = bb->terminator()->GetSingleWordInOperand(0);
      if (cfg()->preds(succ_bb_id).size() == 1) {
        bb = context()->get_instr_block(succ_bb_id);
        continue;
      } else {
        break;
      }
    }

    // The remaining checks need to know the merge node.  If there is no merge
    // instruction or an OpLoopMerge, then it is a break or continue.  We could
    // figure it out, but not worth doing it now.
    Instruction* merge_inst = bb->GetMergeInst();
    if (merge_inst == nullptr ||
        merge_inst->opcode() != spv::Op::OpSelectionMerge) {
      break;
    }

    // Check all of the successors of |bb| it see which lead to a use of |inst|
    // before reaching the merge node.
    bool used_in_multiple_blocks = false;
    uint32_t bb_used_in = 0;
    bb->ForEachSuccessorLabel([this, bb, &bb_used_in, &used_in_multiple_blocks,
                               &bbs_with_uses](uint32_t* succ_bb_id) {
      if (IntersectsPath(*succ_bb_id, bb->MergeBlockIdIfAny(), bbs_with_uses)) {
        if (bb_used_in == 0) {
          bb_used_in = *succ_bb_id;
        } else {
          used_in_multiple_blocks = true;
        }
      }
    });

    // If more than one successor, which is not the merge block, uses |inst|
    // then we have to leave |inst| in bb because there is none of the
    // successors dominate all uses of |inst|.
    if (used_in_multiple_blocks) {
      break;
    }

    if (bb_used_in == 0) {
      // If |inst| is not used before reaching the merge node, then we can move
      // |inst| to the merge node.
      bb = context()->get_instr_block(bb->MergeBlockIdIfAny());
    } else {
      // If the only successor that leads to a used of |inst| has more than 1
      // predecessor, then moving |inst| could cause it to be executed more
      // often, so we cannot move it.
      if (cfg()->preds(bb_used_in).size() != 1) {
        break;
      }

      // If |inst| is used after the merge block, then |bb_used_in| does not
      // dominate all of the uses.  So we cannot move |inst| any further.
      if (IntersectsPath(bb->MergeBlockIdIfAny(), original_bb->id(),
                         bbs_with_uses)) {
        break;
      }

      // Otherwise, |bb_used_in| dominates all uses, so move |inst| into that
      // block.
      bb = context()->get_instr_block(bb_used_in);
    }
    continue;
  }
  return (bb != original_bb ? bb : nullptr);
}